

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::DynamicMapField::InsertOrLookupMapValue
          (DynamicMapField *this,MapKey *map_key,MapValueRef *val)

{
  bool bVar1;
  MapValueRef *other;
  pointer pvVar2;
  MapValueRef *in_RDX;
  key_type *in_RDI;
  MapValueRef *map_val;
  iterator iter;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *map;
  iterator *in_stack_ffffffffffffff88;
  iterator *in_stack_ffffffffffffff90;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *in_stack_ffffffffffffffa0;
  key_type *in_stack_ffffffffffffffa8;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *in_stack_ffffffffffffffb0;
  
  (**(code **)((in_RDI->val_).int64_value_ + 0xa0))();
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::find
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::end(in_stack_ffffffffffffffb0);
  bVar1 = protobuf::operator==(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (bVar1) {
    other = Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::operator[]
                      (in_stack_ffffffffffffffa0,in_RDI);
    AllocateMapValue((DynamicMapField *)map_key,val);
    MapValueRef::CopyFrom(in_RDX,other);
  }
  else {
    pvVar2 = Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::iterator::operator->
                       ((iterator *)0x416984);
    MapValueRef::CopyFrom(in_RDX,&pvVar2->second);
  }
  return bVar1;
}

Assistant:

bool DynamicMapField::InsertOrLookupMapValue(const MapKey& map_key,
                                             MapValueRef* val) {
  // Always use mutable map because users may change the map value by
  // MapValueRef.
  Map<MapKey, MapValueRef>* map = MutableMap();
  Map<MapKey, MapValueRef>::iterator iter = map->find(map_key);
  if (iter == map->end()) {
    MapValueRef& map_val = map_[map_key];
    AllocateMapValue(&map_val);
    val->CopyFrom(map_val);
    return true;
  }
  // map_key is already in the map. Make sure (*map)[map_key] is not called.
  // [] may reorder the map and iterators.
  val->CopyFrom(iter->second);
  return false;
}